

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall cmSourceFile::GetFullPath(cmSourceFile *this,string *error)

{
  bool bVar1;
  
  if ((this->FullPath)._M_string_length == 0) {
    bVar1 = FindFullPath(this,error);
    if (bVar1) {
      CheckExtension(this);
    }
  }
  return &this->FullPath;
}

Assistant:

std::string const& cmSourceFile::GetFullPath(std::string* error)
{
  if(this->FullPath.empty())
    {
    if(this->FindFullPath(error))
      {
      this->CheckExtension();
      }
    }
  return this->FullPath;
}